

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.h
# Opt level: O0

int check_planes_to_loop_filter(loopfilter *lf,int *planes_to_lf,int plane_start,int plane_end)

{
  int in_ECX;
  int in_EDX;
  int *in_RSI;
  loopfilter *in_RDI;
  int local_4;
  
  set_planes_to_loop_filter(in_RDI,in_RSI,in_EDX,in_ECX);
  if (((*in_RSI == 0) && (in_EDX < 1)) && (0 < in_ECX)) {
    local_4 = 0;
  }
  else if (((*in_RSI == 0) && (in_RSI[1] == 0)) && (in_RSI[2] == 0)) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static inline int check_planes_to_loop_filter(const struct loopfilter *lf,
                                              int planes_to_lf[MAX_MB_PLANE],
                                              int plane_start, int plane_end) {
  set_planes_to_loop_filter(lf, planes_to_lf, plane_start, plane_end);
  // If the luma plane is purposely not filtered, neither are the chroma
  // planes.
  if (!planes_to_lf[0] && plane_start <= 0 && 0 < plane_end) return 0;
  // Early exit.
  if (!planes_to_lf[0] && !planes_to_lf[1] && !planes_to_lf[2]) return 0;
  return 1;
}